

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcrepl.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::FunctionReplacer::toReplacerPattern
          (FunctionReplacer *this,UnicodeString *rule,UBool escapeUnprintable)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UnicodeString *srcText;
  __off_t __length;
  ConstChar16Ptr local_80;
  ConstChar16Ptr local_78 [3];
  undefined1 local_60 [8];
  UnicodeString str;
  UBool escapeUnprintable_local;
  UnicodeString *rule_local;
  FunctionReplacer *this_local;
  
  str.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = escapeUnprintable;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_60);
  icu_63::UnicodeString::truncate(rule,(char *)0x0,__length);
  icu_63::UnicodeString::append(rule,L'&');
  iVar1 = (*(this->translit->super_UObject)._vptr_UObject[0xd])();
  icu_63::UnicodeString::append(rule,(UnicodeString *)CONCAT44(extraout_var,iVar1));
  ConstChar16Ptr::ConstChar16Ptr(local_78,L"( ");
  icu_63::UnicodeString::append(rule,local_78,2);
  ConstChar16Ptr::~ConstChar16Ptr(local_78);
  iVar1 = (*(this->replacer->super_UObject)._vptr_UObject[5])();
  srcText = (UnicodeString *)
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar1),local_60,
                       (int)(char)str.fUnion.fStackFields.fBuffer[0x1a]._1_1_);
  icu_63::UnicodeString::append(rule,srcText);
  ConstChar16Ptr::ConstChar16Ptr(&local_80,L" )");
  icu_63::UnicodeString::append(rule,&local_80,2);
  ConstChar16Ptr::~ConstChar16Ptr(&local_80);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return rule;
}

Assistant:

UnicodeString& FunctionReplacer::toReplacerPattern(UnicodeString& rule,
                                                   UBool escapeUnprintable) const {
    UnicodeString str;
    rule.truncate(0);
    rule.append(AMPERSAND);
    rule.append(translit->getID());
    rule.append(OPEN, 2);
    rule.append(replacer->toReplacer()->toReplacerPattern(str, escapeUnprintable));
    rule.append(CLOSE, 2);
    return rule;
}